

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
DensityCalculator<double,_float>::push_adj
          (DensityCalculator<double,_float> *this,size_t *counts,int ncat,int chosen_cat,
          ScoringMetric scoring_metric)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double xmax;
  undefined1 auVar5 [16];
  
  if (ncat < 1) {
    dVar4 = 0.0;
    xmax = 0.0;
  }
  else {
    uVar2 = 0;
    iVar1 = 0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + counts[uVar2];
      iVar1 = (iVar1 + 1) - (uint)(counts[uVar2] == 0);
      uVar2 = uVar2 + 1;
    } while ((uint)ncat != uVar2);
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    xmax = (double)iVar1;
  }
  push_adj(this,0.0,xmax,1.0,
           (((double)CONCAT44(0x45300000,(int)(counts[chosen_cat] >> 0x20)) - 1.9342813113834067e+25
            ) + ((double)CONCAT44(0x43300000,(int)counts[chosen_cat]) - 4503599627370496.0)) / dVar4
           ,scoring_metric);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_adj(size_t *restrict counts, int ncat, int chosen_cat, ScoringMetric scoring_metric)
{
    /* this one assumes 'categ_present' has entries 0/1 for missing/present */
    int cnt_cat = 0;
    size_t cnt = 0;
    for (int cat = 0; cat < ncat; cat++)
    {
        cnt += counts[cat];
        cnt_cat += counts[cat] > 0;
    }

    double pct_tree_left = (ldouble_safe)counts[chosen_cat] / (ldouble_safe)cnt;
    this->push_adj(0., (double)cnt_cat, 1., pct_tree_left, scoring_metric);
}